

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

function<void_(Pipeline_*)> *
QUtil::file_provider(function<void_(Pipeline_*)> *__return_storage_ptr__,string *filename)

{
  string local_38 [32];
  string *local_18;
  string *filename_local;
  
  local_18 = filename;
  filename_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_38,(string *)filename);
  std::function<void(Pipeline*)>::
  function<QUtil::file_provider(std::__cxx11::string_const&)::__0,void>
            ((function<void(Pipeline*)> *)__return_storage_ptr__,
             (anon_class_32_1_bc207785 *)local_38);
  file_provider(std::__cxx11::string_const&)::$_0::~__0((__0 *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(Pipeline*)>
QUtil::file_provider(std::string const& filename)
{
    return [filename](Pipeline* p) { pipe_file(filename.c_str(), p); };
}